

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_pckod_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  *(undefined2 *)((env->active_fpu).fpr + wd) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar2 + 2);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar2 + 10);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar3 + 2);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar3 + 10);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 2) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar2 + 6);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 10) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar3 + 6);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 6) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  *(undefined2 *)((long)(env->active_fpu).fpr + lVar1 + 0xe) =
       *(undefined2 *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  return;
}

Assistant:

void helper_msa_pckod_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->h[3] = pwt->h[2];
    pwd->h[1] = pwt->h[6];
    pwd->h[7] = pws->h[2];
    pwd->h[5] = pws->h[6];
    pwd->h[2] = pwt->h[0];
    pwd->h[6] = pws->h[0];
    pwd->h[0] = pwt->h[4];
    pwd->h[4] = pws->h[4];
#else
    pwd->h[0] = pwt->h[1];
    pwd->h[2] = pwt->h[5];
    pwd->h[4] = pws->h[1];
    pwd->h[6] = pws->h[5];
    pwd->h[1] = pwt->h[3];
    pwd->h[5] = pws->h[3];
    pwd->h[3] = pwt->h[7];
    pwd->h[7] = pws->h[7];
#endif
}